

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::portmap_log_alert::portmap_log_alert
          (portmap_log_alert *this,stack_allocator *alloc,portmap_transport t,char *m)

{
  char *__s;
  allocation_slot aVar1;
  allocator<char> local_35 [13];
  char *local_28;
  char *m_local;
  stack_allocator *psStack_18;
  portmap_transport t_local;
  stack_allocator *alloc_local;
  portmap_log_alert *this_local;
  
  local_28 = m;
  m_local._7_1_ = t;
  psStack_18 = alloc;
  alloc_local = (stack_allocator *)this;
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__portmap_log_alert_00991218;
  this->map_transport = m_local._7_1_;
  std::reference_wrapper<libtorrent::aux::stack_allocator_const>::
  reference_wrapper<libtorrent::aux::stack_allocator&,void,libtorrent::aux::stack_allocator_const*>
            ((reference_wrapper<libtorrent::aux::stack_allocator_const> *)&this->m_alloc,psStack_18)
  ;
  aVar1 = libtorrent::aux::stack_allocator::copy_string(psStack_18,local_28);
  __s = local_28;
  (this->m_log_idx).m_idx = aVar1.m_idx;
  this->map_type = (uint)m_local._7_1_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  return;
}

Assistant:

portmap_log_alert::portmap_log_alert(aux::stack_allocator& alloc
		, portmap_transport const t, const char* m)
		: map_transport(t)
		, m_alloc(alloc)
		, m_log_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, map_type(static_cast<int>(t))
		, msg(m)
#endif
	{}